

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

void tchecker::clockbounds::fill_global_m_map(global_m_map_t *global_m_map,local_lu_map_t *param_2)

{
  loc_id_t lVar1;
  map_t *pmVar2;
  map_t *pmVar3;
  invalid_argument *this;
  loc_id_t loc;
  loc_id_t id;
  
  if (global_m_map->_clock_nb == param_2->_clock_nb) {
    clear(global_m_map->_M);
    lVar1 = param_2->_loc_nb;
    for (id = 0; lVar1 != id; id = id + 1) {
      pmVar2 = global_m_map->_M;
      pmVar3 = local_lu_map_t::L(param_2,id);
      update(pmVar2,pmVar3);
      pmVar2 = global_m_map->_M;
      pmVar3 = local_lu_map_t::U(param_2,id);
      update(pmVar2,pmVar3);
    }
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"*** fill_gloal_m_map: incompatible clock number");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

tchecker::clockbounds::map_t & global_m_map_t::M(void) { return *_M; }